

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::readConstData(PtexReader *this)

{
  bool bVar1;
  int unzipsize;
  uint8_t *puVar2;
  PtexReader *in_RDI;
  int size;
  FilePos in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t nchannels;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->_constdata == (uint8_t *)0x0) {
    seek((PtexReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         in_stack_ffffffffffffffd8);
    unzipsize = in_RDI->_pixelsize * (in_RDI->_header).nfaces;
    puVar2 = (uint8_t *)operator_new__((long)unzipsize);
    in_RDI->_constdata = puVar2;
    readZipBlock(in_RDI,in_RDI->_constdata,(in_RDI->_header).constdatasize,unzipsize);
    if (((in_RDI->_premultiply & 1U) != 0) && (bVar1 = Header::hasAlpha(&in_RDI->_header), bVar1)) {
      nchannels = (in_RDI->_header).nfaces;
      datatype(in_RDI);
      PtexUtils::multalpha
                ((void *)CONCAT44(unzipsize,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20),
                 (DataType)in_RDI,nchannels,in_stack_ffffffffffffffe0);
    }
    increaseMemUsed(in_RDI,(long)unzipsize);
  }
  return;
}

Assistant:

void PtexReader::readConstData()
{
    if (!_constdata) {
        // read compressed constant data block
        seek(_constdatapos);
        int size = _pixelsize * _header.nfaces;
        _constdata = new uint8_t[size];
        readZipBlock(_constdata, _header.constdatasize, size);
        if (_premultiply && _header.hasAlpha())
            PtexUtils::multalpha(_constdata, _header.nfaces, datatype(),
                                 _header.nchannels, _header.alphachan);
        increaseMemUsed(size);
    }
}